

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_code_generator.cc
# Opt level: O1

string_view google::protobuf::compiler::anon_unknown_0::GetTestCase(void)

{
  char *__s;
  size_t sVar1;
  string_view sVar2;
  
  __s = getenv("TEST_CASE");
  if (__s == (char *)0x0) {
    __s = anon_var_dwarf_a12c75 + 5;
    sVar1 = 0;
  }
  else {
    sVar1 = strlen(__s);
  }
  sVar2._M_str = __s;
  sVar2._M_len = sVar1;
  return sVar2;
}

Assistant:

absl::string_view GetTestCase() {
  const char* c_key = getenv("TEST_CASE");
  if (c_key == nullptr) {
    // In Windows, setting 'TEST_CASE=' is equivalent to unsetting
    // and therefore c_key can be nullptr
    return "";
  }
  return c_key;
}